

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  bool bVar4;
  PointerType pSVar5;
  PointerType pBVar6;
  PointerType pSVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  cmLinkedTree<cmDefinitions> *local_a0;
  PositionType local_98;
  iterator origin;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  PositionType local_68;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_50;
  PositionType local_48;
  undefined1 local_30 [8];
  PositionType pos;
  long entryPointLine_local;
  string *entryPointCommand_local;
  cmState *this_local;
  
  pos.Position = entryPointLine;
  bVar4 = Snapshot::IsValid(&originSnapshot);
  if (!bVar4) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x354,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  _local_30 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,originSnapshot.Position);
  PVar3 = pos.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar5->EntryPointLine = PVar3;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  std::__cxx11::string::operator=((string *)&pSVar5->EntryPointCommand,(string *)entryPointCommand);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar5->DirectoryParent).Tree = originSnapshot.Position.Tree;
  (pSVar5->DirectoryParent).Position = originSnapshot.Position.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar5->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar5->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar5->SnapshotType = BuildsystemDirectoryType;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar5->Keep = true;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar8 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,pSVar5->BuildSystemDirectory);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  local_50 = iVar8.Tree;
  (pSVar5->BuildSystemDirectory).Tree = local_50;
  local_48 = iVar8.Position;
  (pSVar5->BuildSystemDirectory).Position = local_48;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar9 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,pSVar5->ExecutionListFile);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  local_70 = iVar9.Tree;
  (pSVar5->ExecutionListFile).Tree = local_70;
  local_68 = iVar9.Position;
  (pSVar5->ExecutionListFile).Position = local_68;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar5->BuildSystemDirectory);
  (pBVar6->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_30;
  (pBVar6->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar7->Policies).Tree = (pSVar5->Policies).Tree;
  (pSVar7->Policies).Position = (pSVar5->Policies).Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar7->PolicyRoot).Tree = (pSVar5->Policies).Tree;
  (pSVar7->PolicyRoot).Position = (pSVar5->Policies).Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar7->PolicyScope).Tree = (pSVar5->Policies).Tree;
  (pSVar7->PolicyScope).Position = (pSVar5->Policies).Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  bVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar5->Policies);
  if (!bVar4) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x366,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  bVar4 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::IsValid(&pSVar5->PolicyRoot);
  if (!bVar4) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x367,
                  "cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot, const std::string &, long)"
                 );
  }
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pcVar1 = (pSVar5->Vars).Tree;
  PVar2 = (pSVar5->Vars).Position;
  iVar10 = pSVar5->Vars;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar5->Parent).Tree = pcVar1;
  (pSVar5->Parent).Position = PVar2;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  (pSVar5->Root).Tree = pcVar1;
  (pSVar5->Root).Position = PVar2;
  iVar10 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar10);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  local_a0 = iVar10.Tree;
  (pSVar5->Vars).Tree = local_a0;
  local_98 = iVar10.Position;
  (pSVar5->Vars).Position = local_98;
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_30);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar5->BuildSystemDirectory);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            (&pBVar6->Children,__return_storage_ptr__);
  Snapshot::SetDefaultDefinitions(__return_storage_ptr__);
  Snapshot::InitializeFromParent(__return_storage_ptr__);
  Snapshot::SetDirectoryDefinitions(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateBuildsystemDirectorySnapshot(Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine)
{
  assert(originSnapshot.IsValid());
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->DirectoryParent = originSnapshot.Position;
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Push(
        originSnapshot.Position->BuildSystemDirectory);
  pos->ExecutionListFile =
      this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = originSnapshot.Position->Policies;
  pos->PolicyRoot = originSnapshot.Position->Policies;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Root = origin;
  pos->Vars = this->VarTree.Push(origin);

  cmState::Snapshot snapshot = cmState::Snapshot(this, pos);
  originSnapshot.Position->BuildSystemDirectory->Children.push_back(snapshot);
  snapshot.SetDefaultDefinitions();
  snapshot.InitializeFromParent();
  snapshot.SetDirectoryDefinitions();
  return snapshot;
}